

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O2

IDenseNetwork * __thiscall
IDenseNetwork::Backward(IDenseNetwork *this,vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  (*(this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
    super__Vector_impl_data._M_finish[-1]->_vptr_ILayer[9])();
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppIVar1 + -1 !=
         (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*ppIVar1[-2]->_vptr_ILayer[9])(ppIVar1[-2],&local_38);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
    ppIVar1 = ppIVar1 + -1;
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::Backward( const std::vector<float> &deltas )
{
    layers.back()->Backward( deltas );
    for ( auto it = layers.rbegin() + 1; it != layers.rend(); ++it ) {
        ( *it )->Backward( {} );
    }
    return *this;
}